

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

bool __thiscall
chrono::ChFunctorArchiveInSpecific<chrono::ChVector<double>_>::IsPolymorphic
          (ChFunctorArchiveInSpecific<chrono::ChVector<double>_> *this)

{
  ChExceptionArchive *this_00;
  allocator local_31;
  string local_30 [32];
  ChFunctorArchiveInSpecific<chrono::ChVector<double>_> *local_10;
  ChFunctorArchiveInSpecific<chrono::ChVector<double>_> *this_local;
  
  local_10 = this;
  this_00 = (ChExceptionArchive *)__cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_30,"Cannot call IsPolymorphic() for a constructed object.",&local_31);
  ChExceptionArchive::ChExceptionArchive(this_00,(string *)local_30);
  __cxa_throw(this_00,&ChExceptionArchive::typeinfo,ChExceptionArchive::~ChExceptionArchive);
}

Assistant:

virtual bool IsPolymorphic() 
        { throw (ChExceptionArchive( "Cannot call IsPolymorphic() for a constructed object.")); }